

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall
Hospital::Id_Validate_for_fire
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  string *this_00;
  string id_1;
  string local_90 [32];
  vector<Nurse,_std::allocator<Nurse>_> local_70;
  string local_58 [48];
  string *local_28;
  string *id_local;
  vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses_local;
  Hospital *this_local;
  
  local_28 = id;
  id_local = (string *)All_Of_Nurses;
  All_Of_Nurses_local = (vector<Nurse,_std::allocator<Nurse>_> *)this;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 8) {
    std::__cxx11::string::string(local_58,(string *)id);
    bVar1 = validate_String_Must_Be_Number(this,(string *)local_58);
    std::__cxx11::string::~string(local_58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<Nurse,_std::allocator<Nurse>_>::vector(&local_70,All_Of_Nurses);
      std::__cxx11::string::string(local_90,(string *)id);
      bVar1 = Existence_Of_Id_For_Nurses(this,&local_70,(string *)local_90);
      std::__cxx11::string::~string(local_90);
      std::vector<Nurse,_std::allocator<Nurse>_>::~vector(&local_70);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_00 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string(this_00,(string *)id);
        __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"This id already not exists !!!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Your id must consist of numbers !");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Your id lenght must be equal to 8 !");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return false;
}

Assistant:

bool Hospital :: Id_Validate_for_fire(vector<Nurse> All_Of_Nurses,string id){
    try {
        if(id.length() != 8) {
            cout <<"Your id lenght must be equal to 8 !"<<endl;
            return false;
        }
        else if(!validate_String_Must_Be_Number(id)) {
            cout <<"Your id must consist of numbers !"<<endl;
            return false;
        }
        else if(! Existence_Of_Id_For_Nurses(All_Of_Nurses ,id)){
            cout << "This id already not exists !!!"<<endl;   ///add bool func to search in file and check existence of id
            return false;
        }
        else throw id;
    }
    catch(string id) {
        cout << "your id entered successfully ."<<endl;
        return true;
    }
}